

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swin_transformer.h
# Opt level: O2

void __thiscall
shift_window_transformer::SwinTransformer<float>::forward
          (SwinTransformer<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  SwinTransformer<float> *pSVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  Tensor<float> tmp4;
  Tensor<float> tmp5;
  Tensor<float> tmp6;
  Tensor<float> tmp3;
  Tensor<float> tmp2;
  Tensor<float> tmp1;
  float local_170;
  float local_16c;
  Tensor<float> *local_168;
  SwinTransformer<float> *local_160;
  Tensor<float> local_158;
  undefined1 local_128 [24];
  pointer piStack_110;
  pointer local_108;
  pointer piStack_100;
  Tensor<float> local_f8;
  Tensor<float> local_c8;
  Tensor<float> local_98;
  Tensor<float> local_68;
  
  local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_c8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_158.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_158.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_158.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_158.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_158.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_158.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_108 = (pointer)0x0;
  piStack_100 = (pointer)0x0;
  local_128._16_8_ = (pointer)0x0;
  piStack_110 = (pointer)0x0;
  local_128._0_8_ = (pointer)0x0;
  local_128._8_8_ = (pointer)0x0;
  local_f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_f8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  StageModule<float>::forward(&this->stage1,input,&local_68);
  StageModule<float>::forward(&this->stage2,&local_68,&local_98);
  StageModule<float>::forward(&this->stage3,&local_98,&local_c8);
  StageModule<float>::forward(&this->stage4,&local_c8,&local_158);
  local_170 = (float)*local_158.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
  local_168 = output;
  local_160 = this;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&piStack_110,&local_170);
  uVar2 = local_158.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[2] *
          local_158.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[1];
  local_16c = (float)(int)uVar2;
  lVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  for (uVar6 = 0; pSVar1 = local_160,
      uVar6 < (ulong)((long)local_158.super_vector<float,_std::allocator<float>_>.
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_158.super_vector<float,_std::allocator<float>_>.
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar6 = uVar6 + (long)(int)uVar2
      ) {
    local_170 = 0.0;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      local_170 = local_170 +
                  *(float *)((long)local_158.super_vector<float,_std::allocator<float>_>.
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start + uVar3 * 4 + lVar5);
    }
    local_170 = local_170 / local_16c;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)local_128,&local_170);
    lVar5 = lVar5 + (long)(int)uVar2 * 4;
  }
  LayerNorm<float>::forward(&local_160->layerNorm,(Tensor<float> *)local_128,&local_f8);
  Linear<float>::forward(&pSVar1->linear,&local_f8,local_168);
  Tensor<float>::~Tensor(&local_f8);
  Tensor<float>::~Tensor((Tensor<float> *)local_128);
  Tensor<float>::~Tensor(&local_158);
  Tensor<float>::~Tensor(&local_c8);
  Tensor<float>::~Tensor(&local_98);
  Tensor<float>::~Tensor(&local_68);
  return;
}

Assistant:

void forward(const Tensor<T> &input, Tensor<T> &output) {
            Tensor<T> tmp1{};
            Tensor<T> tmp2{};
            Tensor<T> tmp3{};
            Tensor<T> tmp4{};
            Tensor<T> tmp5{};
            Tensor<T> tmp6{};
            stage1.forward(input, tmp1);
            stage2.forward(tmp1, tmp2);
            stage3.forward(tmp2, tmp3);
            stage4.forward(tmp3, tmp4);
            tmp5.shape = {tmp4.shape[0]};
            int batch = tmp4.shape[1] * tmp4.shape[2];
            for (int i = 0; i < tmp4.size(); i += batch) {
                T sum = 0;
                for (int j = 0; j < batch; ++j) {
                    sum += tmp4[i + j];
                }
                tmp5.push_back(sum / batch);
            }
            layerNorm.forward(tmp5, tmp6);
            linear.forward(tmp6, output);
        }